

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

shared_ptr<LNode> __thiscall LParser::reduce_55(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar1;
  __shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<LNode> local_40;
  shared_ptr<LNode> var;
  
  get_node((LParser *)&var,in_ESI);
  get_node(this,in_ESI);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,(__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::static_pointer_cast<LNodeData<LNodeChildren>,LNode>(&local_40);
  std::vector<std::shared_ptr<LNode>,std::allocator<std::shared_ptr<LNode>>>::
  emplace_back<std::shared_ptr<LNode>>
            ((vector<std::shared_ptr<LNode>,std::allocator<std::shared_ptr<LNode>>> *)
             (local_40.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1),&var);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&var.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_55() {
    // Vars : Var Vars
    auto var = this->get_node(2);
    auto vars = this->get_node(1);
    lnode_get<LNodeChildren>(vars)->value.push_front(std::move(var));
    return vars;
}